

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidRandomBernoulliDistributionWrongProb(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  RandomBernoulliLikeLayerParams *this_01;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  RandomBernoulliStaticLayerParams *this_02;
  RandomBernoulliDynamicLayerParams *this_03;
  int iVar12;
  int iVar13;
  Result res1;
  Model m;
  Result res3;
  Result res2;
  undefined1 local_c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Model local_98;
  Result local_68;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_98);
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_98.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_c0 + 0x10;
  local_c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar2) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_98.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar2) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_98._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_98);
    local_98._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_98.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_98.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_98.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x4ba) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x4ba;
    this_01 = (RandomBernoulliLikeLayerParams *)operator_new(0x20);
    CoreML::Specification::RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams(this_01);
    (this_00->layer_).randombernoullilike_ = this_01;
  }
  *(undefined4 *)&(((this_00->layer_).convolution_)->kernelsize_).rep_ = 0x3f800347;
  CoreML::validate<(MLModelType)500>((Result *)local_c0,&local_98);
  bVar4 = CoreML::Result::good((Result *)local_c0);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x165c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_c0);
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x302ac4,0);
    if (lVar11 != -1) {
      if (this_00->_oneof_case_[0] != 0x4bf) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
        this_00->_oneof_case_[0] = 0x4bf;
        this_02 = (RandomBernoulliStaticLayerParams *)operator_new(0x38);
        CoreML::Specification::RandomBernoulliStaticLayerParams::RandomBernoulliStaticLayerParams
                  (this_02);
        (this_00->layer_).randombernoullistatic_ = this_02;
      }
      pCVar3 = (this_00->layer_).convolution_;
      iVar13 = (pCVar3->kernelsize_).total_size_;
      if ((pCVar3->kernelsize_).current_size_ == iVar13) {
        google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar3->kernelsize_,iVar13 + 1);
      }
      iVar13 = (pCVar3->kernelsize_).current_size_;
      (pCVar3->kernelsize_).current_size_ = iVar13 + 1;
      ((pCVar3->kernelsize_).rep_)->elements[iVar13] = 3;
      *(undefined4 *)&(pCVar3->stride_).rep_ = 0xc4feb429;
      CoreML::validate<(MLModelType)500>(&local_40,&local_98);
      bVar4 = CoreML::Result::good(&local_40);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1664);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_00196972:
        std::ostream::put((char)poVar9);
        iVar13 = 1;
        std::ostream::flush();
      }
      else {
        psVar10 = CoreML::Result::message_abi_cxx11_(&local_40);
        lVar11 = std::__cxx11::string::find((char *)psVar10,0x302ac4,0);
        if (lVar11 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1665);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"res2.message().find(\"prob\") != std::string::npos",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          goto LAB_00196972;
        }
        if (this_00->_oneof_case_[0] != 0x4c4) {
          CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
          this_00->_oneof_case_[0] = 0x4c4;
          this_03 = (RandomBernoulliDynamicLayerParams *)operator_new(0x20);
          CoreML::Specification::RandomBernoulliDynamicLayerParams::
          RandomBernoulliDynamicLayerParams(this_03);
          (this_00->layer_).randombernoullidynamic_ = this_03;
        }
        *(undefined4 *)&(((this_00->layer_).convolution_)->kernelsize_).rep_ = 0x44800666;
        CoreML::validate<(MLModelType)500>(&local_68,&local_98);
        bVar4 = CoreML::Result::good(&local_68);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x166b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          iVar13 = 1;
          std::ostream::flush();
        }
        else {
          psVar10 = CoreML::Result::message_abi_cxx11_(&local_68);
          iVar13 = 0;
          lVar11 = std::__cxx11::string::find((char *)psVar10,0x302ac4,0);
          if (lVar11 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x166c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"res3.message().find(\"prob\") != std::string::npos",0x30);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9," was false, expected true.",0x1a);
            iVar13 = 1;
            std::endl<char,std::char_traits<char>>(poVar9);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
          operator_delete(local_68.m_message._M_dataplus._M_p,
                          local_68.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
        operator_delete(local_40.m_message._M_dataplus._M_p,
                        local_40.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00196a84;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x165d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"res1.message().find(\"prob\") != std::string::npos",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  iVar13 = 1;
  std::ostream::flush();
LAB_00196a84:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._8_8_ != &local_a8) {
    operator_delete((void *)local_c0._8_8_,local_a8._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_98);
  return iVar13;
}

Assistant:

int testInvalidRandomBernoulliDistributionWrongProb() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of prob should be in range [0.0, 1.0]

    auto* params1 = layers->mutable_randombernoullilike();
    params1->set_prob(1.0001f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("prob") != std::string::npos);

    auto* params2 = layers->mutable_randombernoullistatic();
    params2->add_outputshape(3);
    params2->set_prob(-2037.63f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("prob") != std::string::npos);

    auto* params3 = layers->mutable_randombernoullidynamic();
    params3->set_prob(1024.2f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("prob") != std::string::npos);

    return 0;
}